

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persncal.cpp
# Opt level: O3

void __thiscall
icu_63::PersianCalendar::handleComputeFields
          (PersianCalendar *this,int32_t julianDay,UErrorCode *param_2)

{
  int iVar1;
  short sVar2;
  int iVar3;
  int32_t iVar4;
  int64_t iVar5;
  uint uVar6;
  
  iVar5 = ClockMath::floorDivide((long)julianDay * 0x21 + -0x3d50e9d,0x2f15);
  iVar3 = (int)iVar5;
  iVar4 = ClockMath::floorDivide(iVar3 * 8 + 0x1d,0x21);
  iVar1 = (julianDay - iVar4) + iVar3 * -0x16d;
  if (iVar1 + -0x1dbaa0 < 0xd8) {
    uVar6 = (iVar1 + -0x1dbaa0) / 0x1f;
  }
  else {
    uVar6 = (iVar1 - 0x1dbaa6U) / 0x1e;
  }
  sVar2 = kPersianNumDays[(int)uVar6];
  (this->super_Calendar).fFields[0] = 0;
  (this->super_Calendar).fStamp[0] = 1;
  (this->super_Calendar).fIsSet[0] = '\x01';
  (this->super_Calendar).fFields[1] = iVar3 + 1;
  (this->super_Calendar).fStamp[1] = 1;
  (this->super_Calendar).fStamp[2] = 1;
  (this->super_Calendar).fIsSet[1] = '\x01';
  (this->super_Calendar).fIsSet[2] = '\x01';
  (this->super_Calendar).fFields[0x13] = iVar3 + 1;
  (this->super_Calendar).fStamp[0x13] = 1;
  (this->super_Calendar).fIsSet[0x13] = '\x01';
  (this->super_Calendar).fFields[2] = uVar6;
  (this->super_Calendar).fFields[5] = (iVar1 + -0x1dba9f) - (int)sVar2;
  (this->super_Calendar).fStamp[5] = 1;
  (this->super_Calendar).fStamp[6] = 1;
  (this->super_Calendar).fIsSet[5] = '\x01';
  (this->super_Calendar).fIsSet[6] = '\x01';
  (this->super_Calendar).fFields[6] = iVar1 + -0x1dba9f;
  return;
}

Assistant:

void PersianCalendar::handleComputeFields(int32_t julianDay, UErrorCode &/*status*/) {
    int32_t year, month, dayOfMonth, dayOfYear;

    int32_t daysSinceEpoch = julianDay - PERSIAN_EPOCH;
    year = 1 + (int32_t)ClockMath::floorDivide(33 * (int64_t)daysSinceEpoch + 3, (int64_t)12053);

    int32_t farvardin1 = 365 * (year - 1) + ClockMath::floorDivide(8 * year + 21, 33);
    dayOfYear = (daysSinceEpoch - farvardin1); // 0-based
    if (dayOfYear < 216) { // Compute 0-based month
        month = dayOfYear / 31;
    } else {
        month = (dayOfYear - 6) / 30;
    }
    dayOfMonth = dayOfYear - kPersianNumDays[month] + 1;
    ++dayOfYear; // Make it 1-based now

    internalSet(UCAL_ERA, 0);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_EXTENDED_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DAY_OF_MONTH, dayOfMonth);
    internalSet(UCAL_DAY_OF_YEAR, dayOfYear);
}